

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCryptoHash.cxx
# Opt level: O0

string * __thiscall
cmCryptoHashMD5::Finalize_abi_cxx11_(string *__return_storage_ptr__,cmCryptoHashMD5 *this)

{
  allocator local_39;
  char local_38 [8];
  char md5out [32];
  cmCryptoHashMD5 *this_local;
  
  md5out._24_8_ = this;
  cmsysMD5_FinalizeHex(this->MD5,local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_38,0x20,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCryptoHashMD5::Finalize()
{
  char md5out[32];
  cmsysMD5_FinalizeHex(this->MD5, md5out);
  return std::string(md5out, 32);
}